

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsFMvoice(uint arg_count,long *arg_array)

{
  byte byte;
  
  if (arg_count != 0) {
    MemoryStream_WriteByte(output_stream,0xef);
    byte = (byte)*arg_array;
    if ((arg_count != 1) && (2 < target_driver)) {
      MemoryStream_WriteByte(output_stream,byte | 0x80);
      byte = (char)arg_array[1] + 0x81;
    }
    MemoryStream_WriteByte(output_stream,byte);
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x2c3,"void Macro_smpsFMvoice(unsigned int, long *)");
}

Assistant:

static void Macro_smpsFMvoice(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	WriteByte(0xEF);

	if (target_driver >= 3 && arg_count >= 2)
	{
		WriteByte(arg_array[0] | 0x80);	// Instrument
		WriteByte(arg_array[1] + 0x81);	// ID of the song containing the instrument
	}
	else
	{
		WriteByte(arg_array[0]);	// Instrument
	}
}